

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_expression_assertion.hpp
# Opt level: O2

void __thiscall
iutest::detail::ExpressionLHS<int>::AppendMessage<int>(ExpressionLHS<int> *this,int *value)

{
  Message msg;
  string local_1c0 [32];
  iuStreamMessage local_1a0;
  
  iu_global_format_stringstream::iu_global_format_stringstream(&local_1a0.m_stream);
  iuStreamMessage::operator<<(&local_1a0,value);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::append((string *)&this->m_message);
  std::__cxx11::string::~string(local_1c0);
  iu_global_format_stringstream::~iu_global_format_stringstream(&local_1a0.m_stream);
  return;
}

Assistant:

void AppendMessage(const U& value)
    {
        Message msg;
        msg << value;
        m_message += msg.GetString();
    }